

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O1

duckdb_decimal *
duckdb_value_decimal
          (duckdb_decimal *__return_storage_ptr__,duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  pointer pQVar2;
  reference pvVar3;
  idx_t in_R8;
  
  bVar1 = CanFetchValue(result,col,row);
  if (((result != (duckdb_result *)0x0) && (bVar1)) &&
     ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
      result->internal_data !=
      (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)0x0)) {
    pQVar2 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result->internal_data);
    pvVar3 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                       (&(pQVar2->super_BaseQueryResult).types,col);
    if (pvVar3->id_ == DECIMAL) {
      duckdb::GetInternalCValue<duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,(duckdb *)result,(duckdb_result *)col,row,in_R8);
      return __return_storage_ptr__;
    }
  }
  duckdb::FetchDefaultValue::Operation<duckdb_decimal>();
  return __return_storage_ptr__;
}

Assistant:

duckdb_decimal duckdb_value_decimal(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row) || !ResultIsDecimal(result, col)) {
		return FetchDefaultValue::Operation<duckdb_decimal>();
	}

	return GetInternalCValue<duckdb_decimal>(result, col, row);
}